

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O2

string * __thiscall
Json::valueToString_abi_cxx11_(string *__return_storage_ptr__,Json *this,LargestInt value)

{
  char *pcVar1;
  Json *value_00;
  allocator local_41;
  char *local_40;
  UIntToStringBuffer buffer;
  char local_1f [7];
  
  local_40 = local_1f;
  value_00 = (Json *)-(long)this;
  if (0 < (long)this) {
    value_00 = this;
  }
  uintToString((LargestUInt)value_00,&local_40);
  pcVar1 = local_40;
  if ((long)this < 0) {
    local_40[-1] = '-';
    pcVar1 = pcVar1 + -1;
  }
  if (buffer <= pcVar1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,&local_41);
    return __return_storage_ptr__;
  }
  __assert_fail("current >= buffer",
                "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/lib_json/json_writer.cpp"
                ,0x4c,"std::string Json::valueToString(LargestInt)");
}

Assistant:

std::string valueToString(LargestInt value) {
  UIntToStringBuffer buffer;
  char* current = buffer + sizeof(buffer);
  bool isNegative = value < 0;
  if (isNegative)
    value = -value;
  uintToString(LargestUInt(value), current);
  if (isNegative)
    *--current = '-';
  assert(current >= buffer);
  return current;
}